

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::DirectionalLight>::transform
          (LightNodeImpl<embree::SceneGraph::DirectionalLight> *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  _func_int *p_Var16;
  _func_int *p_Var17;
  _func_int **pp_Var18;
  float *in_RDX;
  
  pp_Var18 = (_func_int **)alignedMalloc(0xa0,0x10);
  fVar1 = space[2].l.vx.field_0.m128[0];
  fVar2 = space[2].l.vx.field_0.m128[1];
  fVar3 = space[2].l.vx.field_0.m128[2];
  fVar4 = in_RDX[8];
  fVar5 = in_RDX[9];
  fVar6 = in_RDX[10];
  fVar7 = in_RDX[0xb];
  fVar8 = in_RDX[4];
  fVar9 = in_RDX[5];
  fVar10 = in_RDX[6];
  fVar11 = in_RDX[7];
  fVar12 = *in_RDX;
  fVar13 = in_RDX[1];
  fVar14 = in_RDX[2];
  fVar15 = in_RDX[3];
  p_Var16 = *(_func_int **)&space[2].l.vy.field_0;
  p_Var17 = *(_func_int **)((long)&space[2].l.vy.field_0 + 8);
  pp_Var18[1] = (_func_int *)0x0;
  pp_Var18[2] = (_func_int *)(pp_Var18 + 4);
  pp_Var18[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var18 + 4) = 0;
  pp_Var18[6] = (_func_int *)(pp_Var18 + 8);
  pp_Var18[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var18 + 8) = 0;
  pp_Var18[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var18 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var18 + 0x5c) = 0xffffffff;
  pp_Var18[0xc] = (_func_int *)0x0;
  *pp_Var18 = (_func_int *)&PTR__Node_002ca970;
  *(undefined4 *)(pp_Var18 + 0xe) = 2;
  *(float *)(pp_Var18 + 0x10) = fVar1 * fVar12 + fVar2 * fVar8 + fVar3 * fVar4;
  *(float *)((long)pp_Var18 + 0x84) = fVar1 * fVar13 + fVar2 * fVar9 + fVar3 * fVar5;
  *(float *)(pp_Var18 + 0x11) = fVar1 * fVar14 + fVar2 * fVar10 + fVar3 * fVar6;
  *(float *)((long)pp_Var18 + 0x8c) = fVar1 * fVar15 + fVar2 * fVar11 + fVar3 * fVar7;
  pp_Var18[0x12] = p_Var16;
  pp_Var18[0x13] = p_Var17;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var18;
  LOCK();
  pp_Var18[1] = pp_Var18[1] + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }